

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

void __thiscall
wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::ConstantExpressionRunner
          (ConstantExpressionRunner<wasm::CExpressionRunner> *this,Module *module,Flags flags,
          Index maxDepth,Index maxLoopIterations)

{
  Index maxLoopIterations_local;
  Index maxDepth_local;
  Flags flags_local;
  Module *module_local;
  ConstantExpressionRunner<wasm::CExpressionRunner> *this_local;
  
  ExpressionRunner<wasm::CExpressionRunner>::ExpressionRunner
            (&this->super_ExpressionRunner<wasm::CExpressionRunner>,module,maxDepth,
             maxLoopIterations);
  (this->super_ExpressionRunner<wasm::CExpressionRunner>)._vptr_ExpressionRunner =
       (_func_int **)&PTR__ConstantExpressionRunner_02715790;
  *(Flags *)&(this->super_ExpressionRunner<wasm::CExpressionRunner>).field_0x1c = flags;
  std::
  unordered_map<unsigned_int,_wasm::Literals,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Literals>_>_>
  ::unordered_map(&this->localValues);
  std::
  unordered_map<wasm::Name,_wasm::Literals,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
  ::unordered_map(&this->globalValues);
  return;
}

Assistant:

ConstantExpressionRunner(Module* module,
                           Flags flags,
                           Index maxDepth,
                           Index maxLoopIterations)
    : ExpressionRunner<SubType>(module, maxDepth, maxLoopIterations),
      flags(flags) {}